

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_insert_multiple_elements_Test::TestBody
          (VectorSUnitTest_insert_multiple_elements_Test *this)

{
  iterator pvVar1;
  char *pcVar2;
  vector_s<unsigned_int,_10UL> v;
  AssertHelper local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined4 local_58;
  vector_s<unsigned_int,_10UL> local_50;
  
  local_70 = (undefined1  [8])&local_60;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  local_58 = 2;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  estl::vector_s<unsigned_int,_10UL>::vector_s(&local_50,(initializer_list<unsigned_int> *)local_70)
  ;
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"0u","v[0]",(uint *)&local_60,local_50.data_ptr_);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x236,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"1u","v[1]",(uint *)&local_60,local_50.data_ptr_ + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"2u","v[2]",(uint *)&local_60,local_50.data_ptr_ + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = 3;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_70,"3u","v.size()",(uint *)&local_78,(unsigned_long *)&local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x239,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_70._0_4_ = 10;
  estl::vector_s<unsigned_int,_10UL>::insert(&local_50,local_50.data_ptr_,0,(uint *)local_70);
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"0u","v[0]",(uint *)&local_60,local_50.data_ptr_);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"1u","v[1]",(uint *)&local_60,local_50.data_ptr_ + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"2u","v[2]",(uint *)&local_60,local_50.data_ptr_ + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = 3;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_70,"3u","v.size()",(uint *)&local_78,(unsigned_long *)&local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_70._0_4_ = 10;
  pvVar1 = estl::vector_s<unsigned_int,_10UL>::insert
                     (&local_50,local_50.data_ptr_,3,(uint *)local_70);
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","*it1",(uint *)&local_60,pvVar1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","*(it1 + 1)",(uint *)&local_60,pvVar1 + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","*(it1 + 2)",(uint *)&local_60,pvVar1 + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[0]",(uint *)&local_60,local_50.data_ptr_);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[1]",(uint *)&local_60,local_50.data_ptr_ + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[2]",(uint *)&local_60,local_50.data_ptr_ + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"0u","v[3]",(uint *)&local_60,local_50.data_ptr_ + 3);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"1u","v[4]",(uint *)&local_60,local_50.data_ptr_ + 4);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"2u","v[5]",(uint *)&local_60,local_50.data_ptr_ + 5);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = 6;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_70,"6u","v.size()",(uint *)&local_78,(unsigned_long *)&local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_70._0_4_ = 0x14;
  pvVar1 = estl::vector_s<unsigned_int,_10UL>::insert
                     (&local_50,local_50.data_ptr_ + 3,2,(uint *)local_70);
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","*it2",(uint *)&local_60,pvVar1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x251,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","*(it2 + 1)",(uint *)&local_60,pvVar1 + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x252,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[0]",(uint *)&local_60,local_50.data_ptr_);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x253,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[1]",(uint *)&local_60,local_50.data_ptr_ + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x254,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[2]",(uint *)&local_60,local_50.data_ptr_ + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x255,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","v[3]",(uint *)&local_60,local_50.data_ptr_ + 3);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x256,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","v[4]",(uint *)&local_60,local_50.data_ptr_ + 4);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,599,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"0u","v[5]",(uint *)&local_60,local_50.data_ptr_ + 5);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,600,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"1u","v[6]",(uint *)&local_60,local_50.data_ptr_ + 6);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x259,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"2u","v[7]",(uint *)&local_60,local_50.data_ptr_ + 7);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = 8;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_70,"8u","v.size()",(uint *)&local_78,(unsigned_long *)&local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_70._0_4_ = 0x32;
  pvVar1 = estl::vector_s<unsigned_int,_10UL>::insert
                     (&local_50,local_50.data_ptr_ + local_50.size_,2,(uint *)local_70);
  local_60._M_head_impl._0_4_ = 0x32;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"50u","*it3",(uint *)&local_60,pvVar1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x32;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"50u","*(it3 + 1)",(uint *)&local_60,pvVar1 + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x260,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[0]",(uint *)&local_60,local_50.data_ptr_);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x261,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[1]",(uint *)&local_60,local_50.data_ptr_ + 1);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x262,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"10u","v[2]",(uint *)&local_60,local_50.data_ptr_ + 2);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x263,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","v[3]",(uint *)&local_60,local_50.data_ptr_ + 3);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x264,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"20u","v[4]",(uint *)&local_60,local_50.data_ptr_ + 4);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x265,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"0u","v[5]",(uint *)&local_60,local_50.data_ptr_ + 5);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"1u","v[6]",(uint *)&local_60,local_50.data_ptr_ + 6);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"2u","v[7]",(uint *)&local_60,local_50.data_ptr_ + 7);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x268,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x32;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"50u","v[8]",(uint *)&local_60,local_50.data_ptr_ + 8);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x269,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_60._M_head_impl._0_4_ = 0x32;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_70,"50u","v[9]",(uint *)&local_60,local_50.data_ptr_ + 9);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = 10;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_70,"10u","v.size()",(uint *)&local_78,(unsigned_long *)&local_60);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_multiple_elements)
{
    vector_s<unsigned, 10> v{0u,1u,2u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert zero elements
    v.insert(v.begin(), 0, 10u);
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert 3 elements from start
    const auto it1 = v.insert(v.begin(), 3, 10u);
    EXPECT_EQ(10u, *it1);
    EXPECT_EQ(10u, *(it1 + 1));
    EXPECT_EQ(10u, *(it1 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(0u, v[3]);
    EXPECT_EQ(1u, v[4]);
    EXPECT_EQ(2u, v[5]);
    EXPECT_EQ(6u, v.size());

    // Insert 2 elements in the middle
    const auto it2 = v.insert(v.begin()+3, 2, 20u);
    EXPECT_EQ(20u, *it2);
    EXPECT_EQ(20u, *(it2 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(8u, v.size());

    // Insert 2 elements 'in' the end
    const auto it3 = v.insert(v.end(), 2, 50u);
    EXPECT_EQ(50u, *it3);
    EXPECT_EQ(50u, *(it3 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(50u, v[8]);
    EXPECT_EQ(50u, v[9]);
    EXPECT_EQ(10u, v.size());
}